

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextQueueUndockNode(ImGuiContext *ctx,ImGuiDockNode *node)

{
  undefined1 local_58 [8];
  ImGuiDockRequest req;
  ImGuiDockNode *node_local;
  ImGuiContext *ctx_local;
  
  req.UndockTargetNode = node;
  ImGuiDockRequest::ImGuiDockRequest((ImGuiDockRequest *)local_58);
  local_58._0_4_ = ImGuiDockRequestType_Undock;
  req.UndockTargetWindow = (ImGuiWindow *)req.UndockTargetNode;
  ImVector<ImGuiDockRequest>::push_back(&(ctx->DockContext).Requests,(ImGuiDockRequest *)local_58);
  return;
}

Assistant:

void ImGui::DockContextQueueUndockNode(ImGuiContext* ctx, ImGuiDockNode* node)
{
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Undock;
    req.UndockTargetNode = node;
    ctx->DockContext.Requests.push_back(req);
}